

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O0

bool __thiscall
dg::pta::PointerGraphValidator::reportInvalNode
          (PointerGraphValidator *this,PSNode *nd,string *user_err)

{
  byte bVar1;
  char *in_RDI;
  string *in_stack_000000a8;
  PSNode *in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x18),"Invalid node:\n");
  dumpNode(in_stack_000000b0,in_stack_000000a8);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x18),(string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  return true;
}

Assistant:

bool PointerGraphValidator::reportInvalNode(const PSNode *nd,
                                            const std::string &user_err) {
    errors += "Invalid node:\n";
    dumpNode(nd, errors);
    if (!user_err.empty())
        errors += "(" + user_err + ")\n";
    return true;
}